

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O1

bool tinyusdz::value::RoleTypeCast(uint32_t roleTyId,Value *inout)

{
  vtable_type *pvVar1;
  void *pvVar2;
  undefined4 uVar3;
  uint32_t uVar4;
  vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_> newval_1;
  texcoord2h newval;
  vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
  val;
  vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> local_158;
  undefined1 local_138 [4];
  undefined1 auStack_134 [4];
  storage_t<tinyusdz::value::matrix4d> sStack_130;
  optional<std::vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>_>
  local_a8;
  undefined7 uStack_88;
  
  pvVar1 = (inout->v_).vtable;
  if (pvVar1 == (vtable_type *)0x0) {
    uVar4 = 2;
  }
  else {
    uVar4 = (*pvVar1->underlying_type_id)();
  }
  if ((int)uVar4 < 0x100011) {
    if (uVar4 == 0x11) {
      if ((roleTyId == 0x49) &&
         (Value::get_value<std::array<tinyusdz::value::half,2ul>>
                    ((optional<std::array<tinyusdz::value::half,_2UL>_> *)local_138,inout,false),
         local_138[0] == true)) {
        local_138[0] = SUB21(local_138._2_2_,0);
        local_138[1] = SUB21(local_138._2_2_,1);
        linb::any::operator=(&inout->v_,(texcoord2h *)local_138);
        return true;
      }
      goto LAB_002c85f6;
    }
LAB_002c85ff:
    if (uVar4 == 0x29) {
      if ((roleTyId == 0x4a) &&
         (Value::get_value<std::array<float,2ul>>
                    ((optional<std::array<float,_2UL>_> *)local_138,inout,false),
         local_138[0] == true)) {
        local_138[0] = SUB21(auStack_134._0_2_,0);
        local_138[1] = SUB21(auStack_134._0_2_,1);
        linb::any::operator=(&inout->v_,(texcoord2f *)local_138);
        return true;
      }
      goto LAB_002c8722;
    }
LAB_002c872b:
    if (((uVar4 == 0x2d) && (roleTyId == 0x4b)) &&
       (Value::get_value<std::array<double,2ul>>
                  ((optional<std::array<double,_2UL>_> *)local_138,inout,false),
       local_138[0] == true)) {
      local_138[0] = SUB21(sStack_130._0_2_,0);
      local_138[1] = (undefined1)((ushort)sStack_130._0_2_ >> 8);
      auStack_134._0_2_ = (undefined2)sStack_130._4_4_;
      auStack_134._2_2_ = (undefined2)((uint)sStack_130._4_4_ >> 0x10);
      sStack_130._0_2_ = (undefined2)sStack_130._8_4_;
      sStack_130._2_2_ = (undefined2)((uint)sStack_130._8_4_ >> 0x10);
      linb::any::operator=(&inout->v_,(texcoord2d *)local_138);
      return true;
    }
  }
  else {
    if (uVar4 == 0x100011) {
      if (roleTyId == 0x100049) {
        Value::
        get_value<std::vector<std::array<tinyusdz::value::half,2ul>,std::allocator<std::array<tinyusdz::value::half,2ul>>>>
                  (&local_a8,inout,false);
        local_138[0] = local_a8.has_value_;
        if (local_a8.has_value_ == true) {
          sStack_130._0_2_ = local_a8.contained._0_2_;
          sStack_130._2_2_ =
               (undefined2)(CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_) >> 0x10);
          sStack_130._4_4_ =
               (undefined4)
               (CONCAT17(local_a8.contained._7_1_,
                         CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) >> 0x20);
          sStack_130._16_8_ = CONCAT17(local_a8.contained._23_1_,local_a8.contained._16_7_);
          sStack_130._8_4_ =
               (undefined4)CONCAT43(local_a8.contained._11_4_,local_a8.contained._8_3_);
          sStack_130._12_4_ =
               (undefined4)
               (CONCAT17(local_a8.contained._15_1_,
                         CONCAT43(local_a8.contained._11_4_,local_a8.contained._8_3_)) >> 0x20);
          local_a8._7_4_ = local_a8._7_4_ & 0xff;
          local_a8.contained._3_4_ = 0;
          local_a8.contained._7_4_ = 0;
          local_a8.contained._11_4_ = 0;
          local_a8.contained._15_1_ = 0;
          local_a8.contained._16_7_ = 0;
          local_a8.contained._23_1_ = 0;
          ::std::
          vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
          ::vector((vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                    *)&local_a8,
                   (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                    *)(auStack_134 + 4));
          local_158.
          super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_158.
          super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_158.
          super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ::std::vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>::
          resize((vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                  *)&local_158,
                 CONCAT17(local_a8.contained._7_1_,
                          CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) -
                 CONCAT17(local_a8._7_1_,
                          CONCAT25(local_a8._5_2_,
                                   CONCAT23(local_a8._3_2_,
                                            CONCAT21(local_a8._1_2_,local_a8.has_value_)))) >> 2);
          pvVar2 = (void *)CONCAT17(local_a8._7_1_,
                                    CONCAT25(local_a8._5_2_,
                                             CONCAT23(local_a8._3_2_,
                                                      CONCAT21(local_a8._1_2_,local_a8.has_value_)))
                                   );
          memcpy(local_158.
                 super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                 ._M_impl.super__Vector_impl_data._M_start,pvVar2,
                 CONCAT17(local_a8.contained._7_1_,
                          CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) -
                 (long)pvVar2);
          linb::any::operator=
                    (&inout->v_,
                     (vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                      *)&local_158);
          goto LAB_002c9a56;
        }
      }
LAB_002c85f6:
      if ((int)uVar4 < 0x100029) goto LAB_002c85ff;
    }
    if (uVar4 == 0x100029) {
      if (roleTyId == 0x10004a) {
        Value::get_value<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>>
                  ((optional<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>
                    *)&local_a8,inout,false);
        local_138[0] = local_a8.has_value_;
        if (local_a8.has_value_ == true) {
          sStack_130._0_2_ = local_a8.contained._0_2_;
          sStack_130._2_2_ =
               (undefined2)(CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_) >> 0x10);
          sStack_130._4_4_ =
               (undefined4)
               (CONCAT17(local_a8.contained._7_1_,
                         CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) >> 0x20);
          sStack_130._16_8_ = CONCAT17(local_a8.contained._23_1_,local_a8.contained._16_7_);
          sStack_130._8_4_ =
               (undefined4)CONCAT43(local_a8.contained._11_4_,local_a8.contained._8_3_);
          sStack_130._12_4_ =
               (undefined4)
               (CONCAT17(local_a8.contained._15_1_,
                         CONCAT43(local_a8.contained._11_4_,local_a8.contained._8_3_)) >> 0x20);
          local_a8._7_4_ = local_a8._7_4_ & 0xff;
          local_a8.contained._3_4_ = 0;
          local_a8.contained._7_4_ = 0;
          local_a8.contained._11_4_ = 0;
          local_a8.contained._15_1_ = 0;
          local_a8.contained._16_7_ = 0;
          local_a8.contained._23_1_ = 0;
          ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::vector
                    ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                     &local_a8,
                     (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                     (auStack_134 + 4));
          local_158.
          super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_158.
          super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_158.
          super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ::std::vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>::
          resize((vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                  *)&local_158,
                 CONCAT17(local_a8.contained._7_1_,
                          CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) -
                 CONCAT17(local_a8._7_1_,
                          CONCAT25(local_a8._5_2_,
                                   CONCAT23(local_a8._3_2_,
                                            CONCAT21(local_a8._1_2_,local_a8.has_value_)))) >> 3);
          pvVar2 = (void *)CONCAT17(local_a8._7_1_,
                                    CONCAT25(local_a8._5_2_,
                                             CONCAT23(local_a8._3_2_,
                                                      CONCAT21(local_a8._1_2_,local_a8.has_value_)))
                                   );
          memcpy(local_158.
                 super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                 ._M_impl.super__Vector_impl_data._M_start,pvVar2,
                 CONCAT17(local_a8.contained._7_1_,
                          CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) -
                 (long)pvVar2);
          linb::any::operator=
                    (&inout->v_,
                     (vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                      *)&local_158);
          goto LAB_002c9a56;
        }
      }
LAB_002c8722:
      if (uVar4 != 0x10002d) goto LAB_002c872b;
    }
    else if (uVar4 != 0x10002d) goto LAB_002c883e;
    if (roleTyId == 0x10004b) {
      Value::get_value<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>
                ((optional<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
                  *)&local_a8,inout,false);
      local_138[0] = local_a8.has_value_;
      if (local_a8.has_value_ == true) {
        sStack_130._0_2_ = local_a8.contained._0_2_;
        sStack_130._2_2_ =
             (undefined2)(CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_) >> 0x10);
        sStack_130._4_4_ =
             (undefined4)
             (CONCAT17(local_a8.contained._7_1_,
                       CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) >> 0x20);
        sStack_130._16_8_ = CONCAT17(local_a8.contained._23_1_,local_a8.contained._16_7_);
        sStack_130._8_4_ = (undefined4)CONCAT43(local_a8.contained._11_4_,local_a8.contained._8_3_);
        sStack_130._12_4_ =
             (undefined4)
             (CONCAT17(local_a8.contained._15_1_,
                       CONCAT43(local_a8.contained._11_4_,local_a8.contained._8_3_)) >> 0x20);
        local_a8._7_4_ = local_a8._7_4_ & 0xff;
        local_a8.contained._3_4_ = 0;
        local_a8.contained._7_4_ = 0;
        local_a8.contained._11_4_ = 0;
        local_a8.contained._15_1_ = 0;
        local_a8.contained._16_7_ = 0;
        local_a8.contained._23_1_ = 0;
        ::std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::vector
                  ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                   &local_a8,
                   (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                   (auStack_134 + 4));
        local_158.
        super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_158.
        super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_158.
        super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ::std::vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>::
        resize((vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_> *)
               &local_158,
               CONCAT17(local_a8.contained._7_1_,
                        CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) -
               CONCAT17(local_a8._7_1_,
                        CONCAT25(local_a8._5_2_,
                                 CONCAT23(local_a8._3_2_,
                                          CONCAT21(local_a8._1_2_,local_a8.has_value_)))) >> 4);
        pvVar2 = (void *)CONCAT17(local_a8._7_1_,
                                  CONCAT25(local_a8._5_2_,
                                           CONCAT23(local_a8._3_2_,
                                                    CONCAT21(local_a8._1_2_,local_a8.has_value_))));
        memcpy(local_158.
               super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
               ._M_impl.super__Vector_impl_data._M_start,pvVar2,
               CONCAT17(local_a8.contained._7_1_,
                        CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) - (long)pvVar2)
        ;
        linb::any::operator=
                  (&inout->v_,
                   (vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                    *)&local_158);
        goto LAB_002c9a56;
      }
    }
  }
LAB_002c883e:
  if (uVar4 == 0x12) {
    if ((roleTyId == 0x4c) &&
       (Value::get_value<std::array<tinyusdz::value::half,3ul>>
                  ((optional<std::array<tinyusdz::value::half,_3UL>_> *)local_138,inout,false),
       local_138[0] == true)) {
      local_a8._5_2_ = auStack_134._2_2_;
      auStack_134._0_2_ = auStack_134._2_2_;
      local_138[0] = SUB21(local_138._2_2_,0);
      local_138[1] = SUB21(local_138._2_2_,1);
      linb::any::operator=(&inout->v_,(texcoord3h *)local_138);
      return true;
    }
  }
  else if ((roleTyId == 0x10004c) && (uVar4 == 0x100012)) {
    Value::
    get_value<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
              ((optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                *)&local_a8,inout,false);
    local_138[0] = local_a8.has_value_;
    if (local_a8.has_value_ == true) {
      sStack_130._0_2_ = local_a8.contained._0_2_;
      sStack_130._2_2_ =
           (undefined2)(CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_) >> 0x10);
      sStack_130._4_4_ =
           (undefined4)
           (CONCAT17(local_a8.contained._7_1_,
                     CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) >> 0x20);
      sStack_130._16_8_ = CONCAT17(local_a8.contained._23_1_,local_a8.contained._16_7_);
      sStack_130._8_4_ = (undefined4)CONCAT43(local_a8.contained._11_4_,local_a8.contained._8_3_);
      sStack_130._12_4_ =
           (undefined4)
           (CONCAT17(local_a8.contained._15_1_,
                     CONCAT43(local_a8.contained._11_4_,local_a8.contained._8_3_)) >> 0x20);
      local_a8._7_4_ = local_a8._7_4_ & 0xff;
      local_a8.contained._3_4_ = 0;
      local_a8.contained._7_4_ = 0;
      local_a8.contained._11_4_ = 0;
      local_a8.contained._15_1_ = 0;
      local_a8.contained._16_7_ = 0;
      local_a8.contained._23_1_ = 0;
      ::std::
      vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
      ::vector((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                *)&local_a8,
               (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                *)(auStack_134 + 4));
      local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>::
      resize((vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_> *)
             &local_158,
             (CONCAT17(local_a8.contained._7_1_,
                       CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) -
              CONCAT17(local_a8._7_1_,
                       CONCAT25(local_a8._5_2_,
                                CONCAT23(local_a8._3_2_,CONCAT21(local_a8._1_2_,local_a8.has_value_)
                                        ))) >> 1) * -0x5555555555555555);
      pvVar2 = (void *)CONCAT17(local_a8._7_1_,
                                CONCAT25(local_a8._5_2_,
                                         CONCAT23(local_a8._3_2_,
                                                  CONCAT21(local_a8._1_2_,local_a8.has_value_))));
      memcpy(local_158.
             super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
             ._M_impl.super__Vector_impl_data._M_start,pvVar2,
             CONCAT17(local_a8.contained._7_1_,
                      CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) - (long)pvVar2);
      linb::any::operator=
                (&inout->v_,
                 (vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                  *)&local_158);
      goto LAB_002c9a56;
    }
  }
  if (uVar4 == 0x2a) {
    if ((roleTyId == 0x4d) &&
       (Value::get_value<std::array<float,3ul>>
                  ((optional<std::array<float,_3UL>_> *)local_138,inout,false), local_138[0] == true
       )) {
      local_a8.contained._3_4_ = sStack_130._4_4_;
      sStack_130._0_2_ = (undefined2)sStack_130._4_4_;
      sStack_130._2_2_ = (undefined2)((uint)sStack_130._4_4_ >> 0x10);
      local_138[0] = SUB21(auStack_134._0_2_,0);
      local_138[1] = SUB21(auStack_134._0_2_,1);
      linb::any::operator=(&inout->v_,(texcoord3f *)local_138);
      return true;
    }
  }
  else if ((roleTyId == 0x10004d) && (uVar4 == 0x10002a)) {
    Value::get_value<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
              ((optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                *)&local_a8,inout,false);
    local_138[0] = local_a8.has_value_;
    if (local_a8.has_value_ == true) {
      sStack_130._0_2_ = local_a8.contained._0_2_;
      sStack_130._2_2_ =
           (undefined2)(CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_) >> 0x10);
      sStack_130._4_4_ =
           (undefined4)
           (CONCAT17(local_a8.contained._7_1_,
                     CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) >> 0x20);
      sStack_130._16_8_ = CONCAT17(local_a8.contained._23_1_,local_a8.contained._16_7_);
      sStack_130._8_4_ = (undefined4)CONCAT43(local_a8.contained._11_4_,local_a8.contained._8_3_);
      sStack_130._12_4_ =
           (undefined4)
           (CONCAT17(local_a8.contained._15_1_,
                     CONCAT43(local_a8.contained._11_4_,local_a8.contained._8_3_)) >> 0x20);
      local_a8._7_4_ = local_a8._7_4_ & 0xff;
      local_a8.contained._3_4_ = 0;
      local_a8.contained._7_4_ = 0;
      local_a8.contained._11_4_ = 0;
      local_a8.contained._15_1_ = 0;
      local_a8.contained._16_7_ = 0;
      local_a8.contained._23_1_ = 0;
      ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::vector
                ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                 &local_a8,
                 (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                 (auStack_134 + 4));
      local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>::
      resize((vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_> *)
             &local_158,
             (CONCAT17(local_a8.contained._7_1_,
                       CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) -
              CONCAT17(local_a8._7_1_,
                       CONCAT25(local_a8._5_2_,
                                CONCAT23(local_a8._3_2_,CONCAT21(local_a8._1_2_,local_a8.has_value_)
                                        ))) >> 2) * -0x5555555555555555);
      pvVar2 = (void *)CONCAT17(local_a8._7_1_,
                                CONCAT25(local_a8._5_2_,
                                         CONCAT23(local_a8._3_2_,
                                                  CONCAT21(local_a8._1_2_,local_a8.has_value_))));
      memcpy(local_158.
             super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
             ._M_impl.super__Vector_impl_data._M_start,pvVar2,
             CONCAT17(local_a8.contained._7_1_,
                      CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) - (long)pvVar2);
      linb::any::operator=
                (&inout->v_,
                 (vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                  *)&local_158);
      goto LAB_002c9a56;
    }
  }
  if (uVar4 == 0x2e) {
    if ((roleTyId == 0x4e) &&
       (Value::get_value<std::array<double,3ul>>
                  ((optional<std::array<double,_3UL>_> *)local_138,inout,false),
       uVar3 = sStack_130._8_4_, local_138[0] == true)) {
      local_a8.contained._15_1_ = (undefined1)sStack_130._16_8_;
      local_a8.contained._16_7_ = (undefined7)((ulong)sStack_130._16_8_ >> 8);
      sStack_130._8_4_ = (undefined4)sStack_130._16_8_;
      sStack_130._12_4_ = (undefined4)((ulong)sStack_130._16_8_ >> 0x20);
      local_138[0] = SUB21(sStack_130._0_2_,0);
      local_138[1] = (undefined1)((ushort)sStack_130._0_2_ >> 8);
      auStack_134._0_2_ = (undefined2)sStack_130._4_4_;
      auStack_134._2_2_ = (undefined2)((uint)sStack_130._4_4_ >> 0x10);
      sStack_130._0_2_ = (undefined2)uVar3;
      sStack_130._2_2_ = (undefined2)((uint)uVar3 >> 0x10);
      linb::any::operator=(&inout->v_,(texcoord3d *)local_138);
      return true;
    }
  }
  else if ((roleTyId == 0x10004e) && (uVar4 == 0x10002e)) {
    Value::get_value<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>
              ((optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                *)&local_a8,inout,false);
    local_138[0] = local_a8.has_value_;
    if (local_a8.has_value_ == true) {
      sStack_130._0_2_ = local_a8.contained._0_2_;
      sStack_130._2_2_ =
           (undefined2)(CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_) >> 0x10);
      sStack_130._4_4_ =
           (undefined4)
           (CONCAT17(local_a8.contained._7_1_,
                     CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) >> 0x20);
      sStack_130._16_8_ = CONCAT17(local_a8.contained._23_1_,local_a8.contained._16_7_);
      sStack_130._8_4_ = (undefined4)CONCAT43(local_a8.contained._11_4_,local_a8.contained._8_3_);
      sStack_130._12_4_ =
           (undefined4)
           (CONCAT17(local_a8.contained._15_1_,
                     CONCAT43(local_a8.contained._11_4_,local_a8.contained._8_3_)) >> 0x20);
      local_a8._7_4_ = local_a8._7_4_ & 0xff;
      local_a8.contained._3_4_ = 0;
      local_a8.contained._7_4_ = 0;
      local_a8.contained._11_4_ = 0;
      local_a8.contained._15_1_ = 0;
      local_a8.contained._16_7_ = 0;
      local_a8.contained._23_1_ = 0;
      ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::vector
                ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                 &local_a8,
                 (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                 (auStack_134 + 4));
      local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>::
      resize((vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_> *)
             &local_158,
             (CONCAT17(local_a8.contained._7_1_,
                       CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) -
              CONCAT17(local_a8._7_1_,
                       CONCAT25(local_a8._5_2_,
                                CONCAT23(local_a8._3_2_,CONCAT21(local_a8._1_2_,local_a8.has_value_)
                                        ))) >> 3) * -0x5555555555555555);
      pvVar2 = (void *)CONCAT17(local_a8._7_1_,
                                CONCAT25(local_a8._5_2_,
                                         CONCAT23(local_a8._3_2_,
                                                  CONCAT21(local_a8._1_2_,local_a8.has_value_))));
      memcpy(local_158.
             super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
             ._M_impl.super__Vector_impl_data._M_start,pvVar2,
             CONCAT17(local_a8.contained._7_1_,
                      CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) - (long)pvVar2);
      linb::any::operator=
                (&inout->v_,
                 (vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                  *)&local_158);
      goto LAB_002c9a56;
    }
  }
  if (uVar4 == 0x12) {
    if ((roleTyId == 0x42) &&
       (Value::get_value<std::array<tinyusdz::value::half,3ul>>
                  ((optional<std::array<tinyusdz::value::half,_3UL>_> *)local_138,inout,false),
       local_138[0] == true)) {
      local_a8._5_2_ = auStack_134._2_2_;
      auStack_134._0_2_ = auStack_134._2_2_;
      local_138[0] = SUB21(local_138._2_2_,0);
      local_138[1] = SUB21(local_138._2_2_,1);
      linb::any::operator=(&inout->v_,(normal3h *)local_138);
      return true;
    }
  }
  else if ((roleTyId == 0x100042) && (uVar4 == 0x100012)) {
    Value::
    get_value<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
              ((optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                *)&local_a8,inout,false);
    local_138[0] = local_a8.has_value_;
    if (local_a8.has_value_ == true) {
      sStack_130._0_2_ = local_a8.contained._0_2_;
      sStack_130._2_2_ =
           (undefined2)(CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_) >> 0x10);
      sStack_130._4_4_ =
           (undefined4)
           (CONCAT17(local_a8.contained._7_1_,
                     CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) >> 0x20);
      sStack_130._16_8_ = CONCAT17(local_a8.contained._23_1_,local_a8.contained._16_7_);
      sStack_130._8_4_ = (undefined4)CONCAT43(local_a8.contained._11_4_,local_a8.contained._8_3_);
      sStack_130._12_4_ =
           (undefined4)
           (CONCAT17(local_a8.contained._15_1_,
                     CONCAT43(local_a8.contained._11_4_,local_a8.contained._8_3_)) >> 0x20);
      local_a8._7_4_ = local_a8._7_4_ & 0xff;
      local_a8.contained._3_4_ = 0;
      local_a8.contained._7_4_ = 0;
      local_a8.contained._11_4_ = 0;
      local_a8.contained._15_1_ = 0;
      local_a8.contained._16_7_ = 0;
      local_a8.contained._23_1_ = 0;
      ::std::
      vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
      ::vector((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                *)&local_a8,
               (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                *)(auStack_134 + 4));
      local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>::resize
                ((vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *)
                 &local_158,
                 (CONCAT17(local_a8.contained._7_1_,
                           CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) -
                  CONCAT17(local_a8._7_1_,
                           CONCAT25(local_a8._5_2_,
                                    CONCAT23(local_a8._3_2_,
                                             CONCAT21(local_a8._1_2_,local_a8.has_value_)))) >> 1) *
                 -0x5555555555555555);
      pvVar2 = (void *)CONCAT17(local_a8._7_1_,
                                CONCAT25(local_a8._5_2_,
                                         CONCAT23(local_a8._3_2_,
                                                  CONCAT21(local_a8._1_2_,local_a8.has_value_))));
      memcpy(local_158.
             super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
             ._M_impl.super__Vector_impl_data._M_start,pvVar2,
             CONCAT17(local_a8.contained._7_1_,
                      CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) - (long)pvVar2);
      linb::any::operator=
                (&inout->v_,
                 (vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *)
                 &local_158);
      goto LAB_002c9a56;
    }
  }
  if (uVar4 == 0x2a) {
    if ((roleTyId == 0x43) &&
       (Value::get_value<std::array<float,3ul>>
                  ((optional<std::array<float,_3UL>_> *)local_138,inout,false), local_138[0] == true
       )) {
      local_a8.contained._3_4_ = sStack_130._4_4_;
      sStack_130._0_2_ = (undefined2)sStack_130._4_4_;
      sStack_130._2_2_ = (undefined2)((uint)sStack_130._4_4_ >> 0x10);
      local_138[0] = SUB21(auStack_134._0_2_,0);
      local_138[1] = SUB21(auStack_134._0_2_,1);
      linb::any::operator=(&inout->v_,(normal3f *)local_138);
      return true;
    }
  }
  else if ((roleTyId == 0x100043) && (uVar4 == 0x10002a)) {
    Value::get_value<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
              ((optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                *)&local_a8,inout,false);
    local_138[0] = local_a8.has_value_;
    if (local_a8.has_value_ == true) {
      sStack_130._0_2_ = local_a8.contained._0_2_;
      sStack_130._2_2_ =
           (undefined2)(CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_) >> 0x10);
      sStack_130._4_4_ =
           (undefined4)
           (CONCAT17(local_a8.contained._7_1_,
                     CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) >> 0x20);
      sStack_130._16_8_ = CONCAT17(local_a8.contained._23_1_,local_a8.contained._16_7_);
      sStack_130._8_4_ = (undefined4)CONCAT43(local_a8.contained._11_4_,local_a8.contained._8_3_);
      sStack_130._12_4_ =
           (undefined4)
           (CONCAT17(local_a8.contained._15_1_,
                     CONCAT43(local_a8.contained._11_4_,local_a8.contained._8_3_)) >> 0x20);
      local_a8._7_4_ = local_a8._7_4_ & 0xff;
      local_a8.contained._3_4_ = 0;
      local_a8.contained._7_4_ = 0;
      local_a8.contained._11_4_ = 0;
      local_a8.contained._15_1_ = 0;
      local_a8.contained._16_7_ = 0;
      local_a8.contained._23_1_ = 0;
      ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::vector
                ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                 &local_a8,
                 (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                 (auStack_134 + 4));
      local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::resize
                ((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
                 &local_158,
                 (CONCAT17(local_a8.contained._7_1_,
                           CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) -
                  CONCAT17(local_a8._7_1_,
                           CONCAT25(local_a8._5_2_,
                                    CONCAT23(local_a8._3_2_,
                                             CONCAT21(local_a8._1_2_,local_a8.has_value_)))) >> 2) *
                 -0x5555555555555555);
      pvVar2 = (void *)CONCAT17(local_a8._7_1_,
                                CONCAT25(local_a8._5_2_,
                                         CONCAT23(local_a8._3_2_,
                                                  CONCAT21(local_a8._1_2_,local_a8.has_value_))));
      memcpy(local_158.
             super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
             ._M_impl.super__Vector_impl_data._M_start,pvVar2,
             CONCAT17(local_a8.contained._7_1_,
                      CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) - (long)pvVar2);
      linb::any::operator=
                (&inout->v_,
                 (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
                 &local_158);
      goto LAB_002c9a56;
    }
  }
  if (uVar4 == 0x2e) {
    if ((roleTyId == 0x44) &&
       (Value::get_value<std::array<double,3ul>>
                  ((optional<std::array<double,_3UL>_> *)local_138,inout,false),
       uVar3 = sStack_130._8_4_, local_138[0] == true)) {
      local_a8.contained._15_1_ = (undefined1)sStack_130._16_8_;
      local_a8.contained._16_7_ = (undefined7)((ulong)sStack_130._16_8_ >> 8);
      sStack_130._8_4_ = (undefined4)sStack_130._16_8_;
      sStack_130._12_4_ = (undefined4)((ulong)sStack_130._16_8_ >> 0x20);
      local_138[0] = SUB21(sStack_130._0_2_,0);
      local_138[1] = (undefined1)((ushort)sStack_130._0_2_ >> 8);
      auStack_134._0_2_ = (undefined2)sStack_130._4_4_;
      auStack_134._2_2_ = (undefined2)((uint)sStack_130._4_4_ >> 0x10);
      sStack_130._0_2_ = (undefined2)uVar3;
      sStack_130._2_2_ = (undefined2)((uint)uVar3 >> 0x10);
      linb::any::operator=(&inout->v_,(normal3d *)local_138);
      return true;
    }
  }
  else if ((roleTyId == 0x100044) && (uVar4 == 0x10002e)) {
    Value::get_value<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>
              ((optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                *)&local_a8,inout,false);
    local_138[0] = local_a8.has_value_;
    if (local_a8.has_value_ == true) {
      sStack_130._0_2_ = local_a8.contained._0_2_;
      sStack_130._2_2_ =
           (undefined2)(CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_) >> 0x10);
      sStack_130._4_4_ =
           (undefined4)
           (CONCAT17(local_a8.contained._7_1_,
                     CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) >> 0x20);
      sStack_130._16_8_ = CONCAT17(local_a8.contained._23_1_,local_a8.contained._16_7_);
      sStack_130._8_4_ = (undefined4)CONCAT43(local_a8.contained._11_4_,local_a8.contained._8_3_);
      sStack_130._12_4_ =
           (undefined4)
           (CONCAT17(local_a8.contained._15_1_,
                     CONCAT43(local_a8.contained._11_4_,local_a8.contained._8_3_)) >> 0x20);
      local_a8._7_4_ = local_a8._7_4_ & 0xff;
      local_a8.contained._3_4_ = 0;
      local_a8.contained._7_4_ = 0;
      local_a8.contained._11_4_ = 0;
      local_a8.contained._15_1_ = 0;
      local_a8.contained._16_7_ = 0;
      local_a8.contained._23_1_ = 0;
      ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::vector
                ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                 &local_a8,
                 (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                 (auStack_134 + 4));
      local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>::resize
                ((vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *)
                 &local_158,
                 (CONCAT17(local_a8.contained._7_1_,
                           CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) -
                  CONCAT17(local_a8._7_1_,
                           CONCAT25(local_a8._5_2_,
                                    CONCAT23(local_a8._3_2_,
                                             CONCAT21(local_a8._1_2_,local_a8.has_value_)))) >> 3) *
                 -0x5555555555555555);
      pvVar2 = (void *)CONCAT17(local_a8._7_1_,
                                CONCAT25(local_a8._5_2_,
                                         CONCAT23(local_a8._3_2_,
                                                  CONCAT21(local_a8._1_2_,local_a8.has_value_))));
      memcpy(local_158.
             super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
             ._M_impl.super__Vector_impl_data._M_start,pvVar2,
             CONCAT17(local_a8.contained._7_1_,
                      CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) - (long)pvVar2);
      linb::any::operator=
                (&inout->v_,
                 (vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *)
                 &local_158);
      goto LAB_002c9a56;
    }
  }
  if (uVar4 == 0x12) {
    if ((roleTyId == 0x45) &&
       (Value::get_value<std::array<tinyusdz::value::half,3ul>>
                  ((optional<std::array<tinyusdz::value::half,_3UL>_> *)local_138,inout,false),
       local_138[0] == true)) {
      local_a8._5_2_ = auStack_134._2_2_;
      auStack_134._0_2_ = auStack_134._2_2_;
      local_138[0] = SUB21(local_138._2_2_,0);
      local_138[1] = SUB21(local_138._2_2_,1);
      linb::any::operator=(&inout->v_,(vector3h *)local_138);
      return true;
    }
  }
  else if ((roleTyId == 0x100045) && (uVar4 == 0x100012)) {
    Value::
    get_value<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
              ((optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                *)&local_a8,inout,false);
    local_138[0] = local_a8.has_value_;
    if (local_a8.has_value_ == true) {
      sStack_130._0_2_ = local_a8.contained._0_2_;
      sStack_130._2_2_ =
           (undefined2)(CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_) >> 0x10);
      sStack_130._4_4_ =
           (undefined4)
           (CONCAT17(local_a8.contained._7_1_,
                     CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) >> 0x20);
      sStack_130._16_8_ = CONCAT17(local_a8.contained._23_1_,local_a8.contained._16_7_);
      sStack_130._8_4_ = (undefined4)CONCAT43(local_a8.contained._11_4_,local_a8.contained._8_3_);
      sStack_130._12_4_ =
           (undefined4)
           (CONCAT17(local_a8.contained._15_1_,
                     CONCAT43(local_a8.contained._11_4_,local_a8.contained._8_3_)) >> 0x20);
      local_a8._7_4_ = local_a8._7_4_ & 0xff;
      local_a8.contained._3_4_ = 0;
      local_a8.contained._7_4_ = 0;
      local_a8.contained._11_4_ = 0;
      local_a8.contained._15_1_ = 0;
      local_a8.contained._16_7_ = 0;
      local_a8.contained._23_1_ = 0;
      ::std::
      vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
      ::vector((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                *)&local_a8,
               (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                *)(auStack_134 + 4));
      local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>::resize
                ((vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *)
                 &local_158,
                 (CONCAT17(local_a8.contained._7_1_,
                           CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) -
                  CONCAT17(local_a8._7_1_,
                           CONCAT25(local_a8._5_2_,
                                    CONCAT23(local_a8._3_2_,
                                             CONCAT21(local_a8._1_2_,local_a8.has_value_)))) >> 1) *
                 -0x5555555555555555);
      pvVar2 = (void *)CONCAT17(local_a8._7_1_,
                                CONCAT25(local_a8._5_2_,
                                         CONCAT23(local_a8._3_2_,
                                                  CONCAT21(local_a8._1_2_,local_a8.has_value_))));
      memcpy(local_158.
             super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
             ._M_impl.super__Vector_impl_data._M_start,pvVar2,
             CONCAT17(local_a8.contained._7_1_,
                      CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) - (long)pvVar2);
      linb::any::operator=
                (&inout->v_,
                 (vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *)
                 &local_158);
      goto LAB_002c9a56;
    }
  }
  if (uVar4 == 0x2a) {
    if ((roleTyId == 0x46) &&
       (Value::get_value<std::array<float,3ul>>
                  ((optional<std::array<float,_3UL>_> *)local_138,inout,false), local_138[0] == true
       )) {
      local_a8.contained._3_4_ = sStack_130._4_4_;
      sStack_130._0_2_ = (undefined2)sStack_130._4_4_;
      sStack_130._2_2_ = (undefined2)((uint)sStack_130._4_4_ >> 0x10);
      local_138[0] = SUB21(auStack_134._0_2_,0);
      local_138[1] = SUB21(auStack_134._0_2_,1);
      linb::any::operator=(&inout->v_,(vector3f *)local_138);
      return true;
    }
  }
  else if ((roleTyId == 0x100046) && (uVar4 == 0x10002a)) {
    Value::get_value<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
              ((optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                *)&local_a8,inout,false);
    local_138[0] = local_a8.has_value_;
    if (local_a8.has_value_ == true) {
      sStack_130._0_2_ = local_a8.contained._0_2_;
      sStack_130._2_2_ =
           (undefined2)(CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_) >> 0x10);
      sStack_130._4_4_ =
           (undefined4)
           (CONCAT17(local_a8.contained._7_1_,
                     CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) >> 0x20);
      sStack_130._16_8_ = CONCAT17(local_a8.contained._23_1_,local_a8.contained._16_7_);
      sStack_130._8_4_ = (undefined4)CONCAT43(local_a8.contained._11_4_,local_a8.contained._8_3_);
      sStack_130._12_4_ =
           (undefined4)
           (CONCAT17(local_a8.contained._15_1_,
                     CONCAT43(local_a8.contained._11_4_,local_a8.contained._8_3_)) >> 0x20);
      local_a8._7_4_ = local_a8._7_4_ & 0xff;
      local_a8.contained._3_4_ = 0;
      local_a8.contained._7_4_ = 0;
      local_a8.contained._11_4_ = 0;
      local_a8.contained._15_1_ = 0;
      local_a8.contained._16_7_ = 0;
      local_a8.contained._23_1_ = 0;
      ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::vector
                ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                 &local_a8,
                 (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                 (auStack_134 + 4));
      local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>::resize
                ((vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *)
                 &local_158,
                 (CONCAT17(local_a8.contained._7_1_,
                           CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) -
                  CONCAT17(local_a8._7_1_,
                           CONCAT25(local_a8._5_2_,
                                    CONCAT23(local_a8._3_2_,
                                             CONCAT21(local_a8._1_2_,local_a8.has_value_)))) >> 2) *
                 -0x5555555555555555);
      pvVar2 = (void *)CONCAT17(local_a8._7_1_,
                                CONCAT25(local_a8._5_2_,
                                         CONCAT23(local_a8._3_2_,
                                                  CONCAT21(local_a8._1_2_,local_a8.has_value_))));
      memcpy(local_158.
             super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
             ._M_impl.super__Vector_impl_data._M_start,pvVar2,
             CONCAT17(local_a8.contained._7_1_,
                      CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) - (long)pvVar2);
      linb::any::operator=
                (&inout->v_,
                 (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *)
                 &local_158);
      goto LAB_002c9a56;
    }
  }
  if (uVar4 == 0x2e) {
    if ((roleTyId == 0x47) &&
       (Value::get_value<std::array<double,3ul>>
                  ((optional<std::array<double,_3UL>_> *)local_138,inout,false),
       uVar3 = sStack_130._8_4_, local_138[0] == true)) {
      local_a8.contained._15_1_ = (undefined1)sStack_130._16_8_;
      local_a8.contained._16_7_ = (undefined7)((ulong)sStack_130._16_8_ >> 8);
      sStack_130._8_4_ = (undefined4)sStack_130._16_8_;
      sStack_130._12_4_ = (undefined4)((ulong)sStack_130._16_8_ >> 0x20);
      local_138[0] = SUB21(sStack_130._0_2_,0);
      local_138[1] = (undefined1)((ushort)sStack_130._0_2_ >> 8);
      auStack_134._0_2_ = (undefined2)sStack_130._4_4_;
      auStack_134._2_2_ = (undefined2)((uint)sStack_130._4_4_ >> 0x10);
      sStack_130._0_2_ = (undefined2)uVar3;
      sStack_130._2_2_ = (undefined2)((uint)uVar3 >> 0x10);
      linb::any::operator=(&inout->v_,(vector3d *)local_138);
      return true;
    }
  }
  else if ((roleTyId == 0x100047) && (uVar4 == 0x10002e)) {
    Value::get_value<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>
              ((optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                *)&local_a8,inout,false);
    local_138[0] = local_a8.has_value_;
    if (local_a8.has_value_ == true) {
      sStack_130._0_2_ = local_a8.contained._0_2_;
      sStack_130._2_2_ =
           (undefined2)(CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_) >> 0x10);
      sStack_130._4_4_ =
           (undefined4)
           (CONCAT17(local_a8.contained._7_1_,
                     CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) >> 0x20);
      sStack_130._16_8_ = CONCAT17(local_a8.contained._23_1_,local_a8.contained._16_7_);
      sStack_130._8_4_ = (undefined4)CONCAT43(local_a8.contained._11_4_,local_a8.contained._8_3_);
      sStack_130._12_4_ =
           (undefined4)
           (CONCAT17(local_a8.contained._15_1_,
                     CONCAT43(local_a8.contained._11_4_,local_a8.contained._8_3_)) >> 0x20);
      local_a8._7_4_ = local_a8._7_4_ & 0xff;
      local_a8.contained._3_4_ = 0;
      local_a8.contained._7_4_ = 0;
      local_a8.contained._11_4_ = 0;
      local_a8.contained._15_1_ = 0;
      local_a8.contained._16_7_ = 0;
      local_a8.contained._23_1_ = 0;
      ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::vector
                ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                 &local_a8,
                 (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                 (auStack_134 + 4));
      local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>::resize
                ((vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *)
                 &local_158,
                 (CONCAT17(local_a8.contained._7_1_,
                           CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) -
                  CONCAT17(local_a8._7_1_,
                           CONCAT25(local_a8._5_2_,
                                    CONCAT23(local_a8._3_2_,
                                             CONCAT21(local_a8._1_2_,local_a8.has_value_)))) >> 3) *
                 -0x5555555555555555);
      pvVar2 = (void *)CONCAT17(local_a8._7_1_,
                                CONCAT25(local_a8._5_2_,
                                         CONCAT23(local_a8._3_2_,
                                                  CONCAT21(local_a8._1_2_,local_a8.has_value_))));
      memcpy(local_158.
             super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
             ._M_impl.super__Vector_impl_data._M_start,pvVar2,
             CONCAT17(local_a8.contained._7_1_,
                      CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) - (long)pvVar2);
      linb::any::operator=
                (&inout->v_,
                 (vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *)
                 &local_158);
      goto LAB_002c9a56;
    }
  }
  if (uVar4 == 0x12) {
    if ((roleTyId == 0x3f) &&
       (Value::get_value<std::array<tinyusdz::value::half,3ul>>
                  ((optional<std::array<tinyusdz::value::half,_3UL>_> *)local_138,inout,false),
       local_138[0] == true)) {
      local_a8._5_2_ = auStack_134._2_2_;
      auStack_134._0_2_ = auStack_134._2_2_;
      local_138[0] = SUB21(local_138._2_2_,0);
      local_138[1] = SUB21(local_138._2_2_,1);
      linb::any::operator=(&inout->v_,(point3h *)local_138);
      return true;
    }
  }
  else if ((roleTyId == 0x10003f) && (uVar4 == 0x100012)) {
    Value::
    get_value<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
              ((optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                *)&local_a8,inout,false);
    local_138[0] = local_a8.has_value_;
    if (local_a8.has_value_ == true) {
      sStack_130._0_2_ = local_a8.contained._0_2_;
      sStack_130._2_2_ =
           (undefined2)(CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_) >> 0x10);
      sStack_130._4_4_ =
           (undefined4)
           (CONCAT17(local_a8.contained._7_1_,
                     CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) >> 0x20);
      sStack_130._16_8_ = CONCAT17(local_a8.contained._23_1_,local_a8.contained._16_7_);
      sStack_130._8_4_ = (undefined4)CONCAT43(local_a8.contained._11_4_,local_a8.contained._8_3_);
      sStack_130._12_4_ =
           (undefined4)
           (CONCAT17(local_a8.contained._15_1_,
                     CONCAT43(local_a8.contained._11_4_,local_a8.contained._8_3_)) >> 0x20);
      local_a8._7_4_ = local_a8._7_4_ & 0xff;
      local_a8.contained._3_4_ = 0;
      local_a8.contained._7_4_ = 0;
      local_a8.contained._11_4_ = 0;
      local_a8.contained._15_1_ = 0;
      local_a8.contained._16_7_ = 0;
      local_a8.contained._23_1_ = 0;
      ::std::
      vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
      ::vector((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                *)&local_a8,
               (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                *)(auStack_134 + 4));
      local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>::resize
                ((vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *)
                 &local_158,
                 (CONCAT17(local_a8.contained._7_1_,
                           CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) -
                  CONCAT17(local_a8._7_1_,
                           CONCAT25(local_a8._5_2_,
                                    CONCAT23(local_a8._3_2_,
                                             CONCAT21(local_a8._1_2_,local_a8.has_value_)))) >> 1) *
                 -0x5555555555555555);
      pvVar2 = (void *)CONCAT17(local_a8._7_1_,
                                CONCAT25(local_a8._5_2_,
                                         CONCAT23(local_a8._3_2_,
                                                  CONCAT21(local_a8._1_2_,local_a8.has_value_))));
      memcpy(local_158.
             super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
             ._M_impl.super__Vector_impl_data._M_start,pvVar2,
             CONCAT17(local_a8.contained._7_1_,
                      CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) - (long)pvVar2);
      linb::any::operator=
                (&inout->v_,
                 (vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *)
                 &local_158);
      goto LAB_002c9a56;
    }
  }
  if (uVar4 == 0x2a) {
    if ((roleTyId == 0x40) &&
       (Value::get_value<std::array<float,3ul>>
                  ((optional<std::array<float,_3UL>_> *)local_138,inout,false), local_138[0] == true
       )) {
      local_a8.contained._3_4_ = sStack_130._4_4_;
      sStack_130._0_2_ = (undefined2)sStack_130._4_4_;
      sStack_130._2_2_ = (undefined2)((uint)sStack_130._4_4_ >> 0x10);
      local_138[0] = SUB21(auStack_134._0_2_,0);
      local_138[1] = SUB21(auStack_134._0_2_,1);
      linb::any::operator=(&inout->v_,(point3f *)local_138);
      return true;
    }
  }
  else if ((roleTyId == 0x100040) && (uVar4 == 0x10002a)) {
    Value::get_value<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
              ((optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                *)&local_a8,inout,false);
    local_138[0] = local_a8.has_value_;
    if (local_a8.has_value_ == true) {
      sStack_130._0_2_ = local_a8.contained._0_2_;
      sStack_130._2_2_ =
           (undefined2)(CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_) >> 0x10);
      sStack_130._4_4_ =
           (undefined4)
           (CONCAT17(local_a8.contained._7_1_,
                     CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) >> 0x20);
      sStack_130._16_8_ = CONCAT17(local_a8.contained._23_1_,local_a8.contained._16_7_);
      sStack_130._8_4_ = (undefined4)CONCAT43(local_a8.contained._11_4_,local_a8.contained._8_3_);
      sStack_130._12_4_ =
           (undefined4)
           (CONCAT17(local_a8.contained._15_1_,
                     CONCAT43(local_a8.contained._11_4_,local_a8.contained._8_3_)) >> 0x20);
      local_a8._7_4_ = local_a8._7_4_ & 0xff;
      local_a8.contained._3_4_ = 0;
      local_a8.contained._7_4_ = 0;
      local_a8.contained._11_4_ = 0;
      local_a8.contained._15_1_ = 0;
      local_a8.contained._16_7_ = 0;
      local_a8.contained._23_1_ = 0;
      ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::vector
                ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                 &local_a8,
                 (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                 (auStack_134 + 4));
      local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::resize
                ((vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
                 &local_158,
                 (CONCAT17(local_a8.contained._7_1_,
                           CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) -
                  CONCAT17(local_a8._7_1_,
                           CONCAT25(local_a8._5_2_,
                                    CONCAT23(local_a8._3_2_,
                                             CONCAT21(local_a8._1_2_,local_a8.has_value_)))) >> 2) *
                 -0x5555555555555555);
      pvVar2 = (void *)CONCAT17(local_a8._7_1_,
                                CONCAT25(local_a8._5_2_,
                                         CONCAT23(local_a8._3_2_,
                                                  CONCAT21(local_a8._1_2_,local_a8.has_value_))));
      memcpy(local_158.
             super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
             ._M_impl.super__Vector_impl_data._M_start,pvVar2,
             CONCAT17(local_a8.contained._7_1_,
                      CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) - (long)pvVar2);
      linb::any::operator=
                (&inout->v_,
                 (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
                 &local_158);
      goto LAB_002c9a56;
    }
  }
  if (uVar4 == 0x2e) {
    if ((roleTyId == 0x41) &&
       (Value::get_value<std::array<double,3ul>>
                  ((optional<std::array<double,_3UL>_> *)local_138,inout,false),
       uVar3 = sStack_130._8_4_, local_138[0] == true)) {
      local_a8.contained._15_1_ = (undefined1)sStack_130._16_8_;
      local_a8.contained._16_7_ = (undefined7)((ulong)sStack_130._16_8_ >> 8);
      sStack_130._8_4_ = (undefined4)sStack_130._16_8_;
      sStack_130._12_4_ = (undefined4)((ulong)sStack_130._16_8_ >> 0x20);
      local_138[0] = SUB21(sStack_130._0_2_,0);
      local_138[1] = (undefined1)((ushort)sStack_130._0_2_ >> 8);
      auStack_134._0_2_ = (undefined2)sStack_130._4_4_;
      auStack_134._2_2_ = (undefined2)((uint)sStack_130._4_4_ >> 0x10);
      sStack_130._0_2_ = (undefined2)uVar3;
      sStack_130._2_2_ = (undefined2)((uint)uVar3 >> 0x10);
      linb::any::operator=(&inout->v_,(point3d *)local_138);
      return true;
    }
  }
  else if ((roleTyId == 0x100041) && (uVar4 == 0x10002e)) {
    Value::get_value<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>
              ((optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                *)&local_a8,inout,false);
    local_138[0] = local_a8.has_value_;
    if (local_a8.has_value_ == true) {
      sStack_130._0_2_ = local_a8.contained._0_2_;
      sStack_130._2_2_ =
           (undefined2)(CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_) >> 0x10);
      sStack_130._4_4_ =
           (undefined4)
           (CONCAT17(local_a8.contained._7_1_,
                     CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) >> 0x20);
      sStack_130._16_8_ = CONCAT17(local_a8.contained._23_1_,local_a8.contained._16_7_);
      sStack_130._8_4_ = (undefined4)CONCAT43(local_a8.contained._11_4_,local_a8.contained._8_3_);
      sStack_130._12_4_ =
           (undefined4)
           (CONCAT17(local_a8.contained._15_1_,
                     CONCAT43(local_a8.contained._11_4_,local_a8.contained._8_3_)) >> 0x20);
      local_a8._7_4_ = local_a8._7_4_ & 0xff;
      local_a8.contained._3_4_ = 0;
      local_a8.contained._7_4_ = 0;
      local_a8.contained._11_4_ = 0;
      local_a8.contained._15_1_ = 0;
      local_a8.contained._16_7_ = 0;
      local_a8.contained._23_1_ = 0;
      ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::vector
                ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                 &local_a8,
                 (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                 (auStack_134 + 4));
      local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>::resize
                ((vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *)
                 &local_158,
                 (CONCAT17(local_a8.contained._7_1_,
                           CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) -
                  CONCAT17(local_a8._7_1_,
                           CONCAT25(local_a8._5_2_,
                                    CONCAT23(local_a8._3_2_,
                                             CONCAT21(local_a8._1_2_,local_a8.has_value_)))) >> 3) *
                 -0x5555555555555555);
      pvVar2 = (void *)CONCAT17(local_a8._7_1_,
                                CONCAT25(local_a8._5_2_,
                                         CONCAT23(local_a8._3_2_,
                                                  CONCAT21(local_a8._1_2_,local_a8.has_value_))));
      memcpy(local_158.
             super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
             ._M_impl.super__Vector_impl_data._M_start,pvVar2,
             CONCAT17(local_a8.contained._7_1_,
                      CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) - (long)pvVar2);
      linb::any::operator=
                (&inout->v_,
                 (vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *)
                 &local_158);
      goto LAB_002c9a56;
    }
  }
  if (uVar4 == 0x12) {
    if ((roleTyId == 0x39) &&
       (Value::get_value<std::array<tinyusdz::value::half,3ul>>
                  ((optional<std::array<tinyusdz::value::half,_3UL>_> *)local_138,inout,false),
       local_138[0] == true)) {
      local_a8._5_2_ = auStack_134._2_2_;
      auStack_134._0_2_ = auStack_134._2_2_;
      local_138[0] = SUB21(local_138._2_2_,0);
      local_138[1] = SUB21(local_138._2_2_,1);
      linb::any::operator=(&inout->v_,(color3h *)local_138);
      return true;
    }
  }
  else if ((roleTyId == 0x100039) && (uVar4 == 0x100012)) {
    Value::
    get_value<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
              ((optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                *)&local_a8,inout,false);
    local_138[0] = local_a8.has_value_;
    if (local_a8.has_value_ == true) {
      sStack_130._0_2_ = local_a8.contained._0_2_;
      sStack_130._2_2_ =
           (undefined2)(CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_) >> 0x10);
      sStack_130._4_4_ =
           (undefined4)
           (CONCAT17(local_a8.contained._7_1_,
                     CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) >> 0x20);
      sStack_130._16_8_ = CONCAT17(local_a8.contained._23_1_,local_a8.contained._16_7_);
      sStack_130._8_4_ = (undefined4)CONCAT43(local_a8.contained._11_4_,local_a8.contained._8_3_);
      sStack_130._12_4_ =
           (undefined4)
           (CONCAT17(local_a8.contained._15_1_,
                     CONCAT43(local_a8.contained._11_4_,local_a8.contained._8_3_)) >> 0x20);
      local_a8._7_4_ = local_a8._7_4_ & 0xff;
      local_a8.contained._3_4_ = 0;
      local_a8.contained._7_4_ = 0;
      local_a8.contained._11_4_ = 0;
      local_a8.contained._15_1_ = 0;
      local_a8.contained._16_7_ = 0;
      local_a8.contained._23_1_ = 0;
      ::std::
      vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
      ::vector((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                *)&local_a8,
               (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                *)(auStack_134 + 4));
      local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>::resize
                ((vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_> *)
                 &local_158,
                 (CONCAT17(local_a8.contained._7_1_,
                           CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) -
                  CONCAT17(local_a8._7_1_,
                           CONCAT25(local_a8._5_2_,
                                    CONCAT23(local_a8._3_2_,
                                             CONCAT21(local_a8._1_2_,local_a8.has_value_)))) >> 1) *
                 -0x5555555555555555);
      pvVar2 = (void *)CONCAT17(local_a8._7_1_,
                                CONCAT25(local_a8._5_2_,
                                         CONCAT23(local_a8._3_2_,
                                                  CONCAT21(local_a8._1_2_,local_a8.has_value_))));
      memcpy(local_158.
             super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
             ._M_impl.super__Vector_impl_data._M_start,pvVar2,
             CONCAT17(local_a8.contained._7_1_,
                      CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) - (long)pvVar2);
      linb::any::operator=
                (&inout->v_,
                 (vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_> *)
                 &local_158);
      goto LAB_002c9a56;
    }
  }
  if (uVar4 == 0x2a) {
    if ((roleTyId == 0x3a) &&
       (Value::get_value<std::array<float,3ul>>
                  ((optional<std::array<float,_3UL>_> *)local_138,inout,false), local_138[0] == true
       )) {
      local_a8.contained._3_4_ = sStack_130._4_4_;
      sStack_130._0_2_ = (undefined2)sStack_130._4_4_;
      sStack_130._2_2_ = (undefined2)((uint)sStack_130._4_4_ >> 0x10);
      local_138[0] = SUB21(auStack_134._0_2_,0);
      local_138[1] = SUB21(auStack_134._0_2_,1);
      linb::any::operator=(&inout->v_,(color3f *)local_138);
      return true;
    }
  }
  else if ((roleTyId == 0x10003a) && (uVar4 == 0x10002a)) {
    Value::get_value<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
              ((optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                *)&local_a8,inout,false);
    local_138[0] = local_a8.has_value_;
    if (local_a8.has_value_ == true) {
      sStack_130._0_2_ = local_a8.contained._0_2_;
      sStack_130._2_2_ =
           (undefined2)(CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_) >> 0x10);
      sStack_130._4_4_ =
           (undefined4)
           (CONCAT17(local_a8.contained._7_1_,
                     CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) >> 0x20);
      sStack_130._16_8_ = CONCAT17(local_a8.contained._23_1_,local_a8.contained._16_7_);
      sStack_130._8_4_ = (undefined4)CONCAT43(local_a8.contained._11_4_,local_a8.contained._8_3_);
      sStack_130._12_4_ =
           (undefined4)
           (CONCAT17(local_a8.contained._15_1_,
                     CONCAT43(local_a8.contained._11_4_,local_a8.contained._8_3_)) >> 0x20);
      local_a8._7_4_ = local_a8._7_4_ & 0xff;
      local_a8.contained._3_4_ = 0;
      local_a8.contained._7_4_ = 0;
      local_a8.contained._11_4_ = 0;
      local_a8.contained._15_1_ = 0;
      local_a8.contained._16_7_ = 0;
      local_a8.contained._23_1_ = 0;
      ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::vector
                ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                 &local_a8,
                 (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                 (auStack_134 + 4));
      local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>::resize
                ((vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)
                 &local_158,
                 (CONCAT17(local_a8.contained._7_1_,
                           CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) -
                  CONCAT17(local_a8._7_1_,
                           CONCAT25(local_a8._5_2_,
                                    CONCAT23(local_a8._3_2_,
                                             CONCAT21(local_a8._1_2_,local_a8.has_value_)))) >> 2) *
                 -0x5555555555555555);
      pvVar2 = (void *)CONCAT17(local_a8._7_1_,
                                CONCAT25(local_a8._5_2_,
                                         CONCAT23(local_a8._3_2_,
                                                  CONCAT21(local_a8._1_2_,local_a8.has_value_))));
      memcpy(local_158.
             super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
             ._M_impl.super__Vector_impl_data._M_start,pvVar2,
             CONCAT17(local_a8.contained._7_1_,
                      CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) - (long)pvVar2);
      linb::any::operator=
                (&inout->v_,
                 (vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)
                 &local_158);
      goto LAB_002c9a56;
    }
  }
  if (uVar4 == 0x2e) {
    if ((roleTyId == 0x3b) &&
       (Value::get_value<std::array<double,3ul>>
                  ((optional<std::array<double,_3UL>_> *)local_138,inout,false),
       uVar3 = sStack_130._8_4_, local_138[0] == true)) {
      local_a8.contained._15_1_ = (undefined1)sStack_130._16_8_;
      local_a8.contained._16_7_ = (undefined7)((ulong)sStack_130._16_8_ >> 8);
      sStack_130._8_4_ = (undefined4)sStack_130._16_8_;
      sStack_130._12_4_ = (undefined4)((ulong)sStack_130._16_8_ >> 0x20);
      local_138[0] = SUB21(sStack_130._0_2_,0);
      local_138[1] = (undefined1)((ushort)sStack_130._0_2_ >> 8);
      auStack_134._0_2_ = (undefined2)sStack_130._4_4_;
      auStack_134._2_2_ = (undefined2)((uint)sStack_130._4_4_ >> 0x10);
      sStack_130._0_2_ = (undefined2)uVar3;
      sStack_130._2_2_ = (undefined2)((uint)uVar3 >> 0x10);
      linb::any::operator=(&inout->v_,(color3d *)local_138);
      return true;
    }
  }
  else if ((roleTyId == 0x10003b) && (uVar4 == 0x10002e)) {
    Value::get_value<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>
              ((optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                *)&local_a8,inout,false);
    local_138[0] = local_a8.has_value_;
    if (local_a8.has_value_ == true) {
      sStack_130._0_2_ = local_a8.contained._0_2_;
      sStack_130._2_2_ =
           (undefined2)(CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_) >> 0x10);
      sStack_130._4_4_ =
           (undefined4)
           (CONCAT17(local_a8.contained._7_1_,
                     CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) >> 0x20);
      sStack_130._16_8_ = CONCAT17(local_a8.contained._23_1_,local_a8.contained._16_7_);
      sStack_130._8_4_ = (undefined4)CONCAT43(local_a8.contained._11_4_,local_a8.contained._8_3_);
      sStack_130._12_4_ =
           (undefined4)
           (CONCAT17(local_a8.contained._15_1_,
                     CONCAT43(local_a8.contained._11_4_,local_a8.contained._8_3_)) >> 0x20);
      local_a8._7_4_ = local_a8._7_4_ & 0xff;
      local_a8.contained._3_4_ = 0;
      local_a8.contained._7_4_ = 0;
      local_a8.contained._11_4_ = 0;
      local_a8.contained._15_1_ = 0;
      local_a8.contained._16_7_ = 0;
      local_a8.contained._23_1_ = 0;
      ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::vector
                ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                 &local_a8,
                 (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                 (auStack_134 + 4));
      local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>::resize
                (&local_158,
                 (CONCAT17(local_a8.contained._7_1_,
                           CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) -
                  CONCAT17(local_a8._7_1_,
                           CONCAT25(local_a8._5_2_,
                                    CONCAT23(local_a8._3_2_,
                                             CONCAT21(local_a8._1_2_,local_a8.has_value_)))) >> 3) *
                 -0x5555555555555555);
      pvVar2 = (void *)CONCAT17(local_a8._7_1_,
                                CONCAT25(local_a8._5_2_,
                                         CONCAT23(local_a8._3_2_,
                                                  CONCAT21(local_a8._1_2_,local_a8.has_value_))));
      memcpy(local_158.
             super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
             ._M_impl.super__Vector_impl_data._M_start,pvVar2,
             CONCAT17(local_a8.contained._7_1_,
                      CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) - (long)pvVar2);
      linb::any::operator=(&inout->v_,&local_158);
      goto LAB_002c9a56;
    }
  }
  if ((int)uVar4 < 0x100013) {
    if ((int)uVar4 < 0x2f) {
      if (uVar4 == 0x13) {
        if ((roleTyId == 0x3c) &&
           (Value::get_value<std::array<tinyusdz::value::half,4ul>>
                      ((optional<std::array<tinyusdz::value::half,_4UL>_> *)local_138,inout,false),
           local_138[0] == true)) {
          local_138[0] = SUB21(local_138._2_2_,0);
          local_138[1] = SUB21(local_138._2_2_,1);
          linb::any::operator=(&inout->v_,(color4h *)local_138);
          return true;
        }
        goto LAB_002c9d14;
      }
      if (uVar4 != 0x2b) {
        return false;
      }
LAB_002c9ad8:
      if ((roleTyId == 0x3d) &&
         (Value::get_value<std::array<float,4ul>>
                    ((optional<std::array<float,_4UL>_> *)local_138,inout,false),
         local_138[0] == true)) {
        local_138[0] = SUB21(auStack_134._0_2_,0);
        local_138[1] = SUB21(auStack_134._0_2_,1);
        sStack_130._0_2_ = (undefined2)sStack_130._4_4_;
        sStack_130._2_2_ = (undefined2)((uint)sStack_130._4_4_ >> 0x10);
        linb::any::operator=(&inout->v_,(color4f *)local_138);
        return true;
      }
      goto LAB_002c9c02;
    }
LAB_002c9d29:
    if (uVar4 != 0x2f) {
      if (uVar4 != 0x38) {
        return false;
      }
      goto LAB_002c9e93;
    }
    if ((roleTyId == 0x3e) &&
       (Value::get_value<std::array<double,4ul>>
                  ((optional<std::array<double,_4UL>_> *)local_138,inout,false),
       uVar3 = sStack_130._8_4_, local_138[0] == true)) {
      local_a8.contained._15_1_ = (undefined1)sStack_130._16_8_;
      local_a8.contained._16_7_ = (undefined7)((ulong)sStack_130._16_8_ >> 8);
      local_a8.contained._23_1_ = (undefined1)sStack_130._24_8_;
      uStack_88 = (undefined7)((ulong)sStack_130._24_8_ >> 8);
      sStack_130._8_4_ = (undefined4)sStack_130._16_8_;
      sStack_130._12_4_ = (undefined4)((ulong)sStack_130._16_8_ >> 0x20);
      sStack_130._16_8_ = sStack_130._24_8_;
      local_138[0] = SUB21(sStack_130._0_2_,0);
      local_138[1] = (undefined1)((ushort)sStack_130._0_2_ >> 8);
      auStack_134._0_2_ = (undefined2)sStack_130._4_4_;
      auStack_134._2_2_ = (undefined2)((uint)sStack_130._4_4_ >> 0x10);
      sStack_130._0_2_ = (undefined2)uVar3;
      sStack_130._2_2_ = (undefined2)((uint)uVar3 >> 0x10);
      linb::any::operator=(&inout->v_,(color4d *)local_138);
      return true;
    }
LAB_002c9e7c:
    if (uVar4 != 0x100038) {
      if (uVar4 != 0x38) {
        return false;
      }
LAB_002c9e93:
      if (roleTyId != 0x48) {
        return false;
      }
      Value::get_value<tinyusdz::value::matrix4d>
                ((optional<tinyusdz::value::matrix4d> *)local_138,inout,false);
      if (local_138[0] == true) {
        memcpy(&local_a8.field_0x7,auStack_134 + 4,0x80);
        local_138[0] = false;
        local_138[1] = 0;
        local_138._2_2_ = (anon_struct_2_0_00000001_for___align)0x0;
        auStack_134._0_2_ = 0;
        auStack_134._2_2_ = 0x3ff0;
        sStack_130._0_2_ = 0;
        sStack_130._2_2_ = 0;
        sStack_130._4_4_ = 0;
        sStack_130._8_4_ = 0;
        sStack_130._12_4_ = 0;
        sStack_130._16_8_ = 0;
        sStack_130._24_8_ = 0;
        sStack_130._32_8_ = 0x3ff0000000000000;
        sStack_130._40_8_ = 0;
        sStack_130._48_8_ = 0;
        sStack_130._56_8_ = 0;
        sStack_130._64_8_ = 0;
        sStack_130._72_8_ = 0x3ff0000000000000;
        sStack_130._80_8_ = 0;
        sStack_130._88_8_ = 0;
        sStack_130._96_8_ = 0;
        sStack_130._104_8_ = 0;
        sStack_130._112_8_ = 0x3ff0000000000000;
        memcpy((frame4d *)local_138,&local_a8.field_0x7,0x80);
        linb::any::operator=(&inout->v_,(frame4d *)local_138);
        return true;
      }
      return false;
    }
  }
  else {
    if ((int)uVar4 < 0x10002f) {
      if (uVar4 == 0x100013) {
        if (roleTyId == 0x10003c) {
          Value::
          get_value<std::vector<std::array<tinyusdz::value::half,4ul>,std::allocator<std::array<tinyusdz::value::half,4ul>>>>
                    ((optional<std::vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>_>
                      *)&local_a8,inout,false);
          local_138[0] = local_a8.has_value_;
          if (local_a8.has_value_ == true) {
            sStack_130._0_2_ = local_a8.contained._0_2_;
            sStack_130._2_2_ =
                 (undefined2)(CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_) >> 0x10);
            sStack_130._4_4_ =
                 (undefined4)
                 (CONCAT17(local_a8.contained._7_1_,
                           CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) >> 0x20);
            sStack_130._16_8_ = CONCAT17(local_a8.contained._23_1_,local_a8.contained._16_7_);
            sStack_130._8_4_ =
                 (undefined4)CONCAT43(local_a8.contained._11_4_,local_a8.contained._8_3_);
            sStack_130._12_4_ =
                 (undefined4)
                 (CONCAT17(local_a8.contained._15_1_,
                           CONCAT43(local_a8.contained._11_4_,local_a8.contained._8_3_)) >> 0x20);
            local_a8._7_4_ = local_a8._7_4_ & 0xff;
            local_a8.contained._3_4_ = 0;
            local_a8.contained._7_4_ = 0;
            local_a8.contained._11_4_ = 0;
            local_a8.contained._15_1_ = 0;
            local_a8.contained._16_7_ = 0;
            local_a8.contained._23_1_ = 0;
            ::std::
            vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
            ::vector((vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                      *)&local_a8,
                     (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                      *)(auStack_134 + 4));
            local_158.
            super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_158.
            super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_158.
            super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            ::std::vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>::
            resize((vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_> *)
                   &local_158,
                   CONCAT17(local_a8.contained._7_1_,
                            CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) -
                   CONCAT17(local_a8._7_1_,
                            CONCAT25(local_a8._5_2_,
                                     CONCAT23(local_a8._3_2_,
                                              CONCAT21(local_a8._1_2_,local_a8.has_value_)))) >> 3);
            pvVar2 = (void *)CONCAT17(local_a8._7_1_,
                                      CONCAT25(local_a8._5_2_,
                                               CONCAT23(local_a8._3_2_,
                                                        CONCAT21(local_a8._1_2_,local_a8.has_value_)
                                                       )));
            memcpy(local_158.
                   super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                   ._M_impl.super__Vector_impl_data._M_start,pvVar2,
                   CONCAT17(local_a8.contained._7_1_,
                            CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) -
                   (long)pvVar2);
            linb::any::operator=
                      (&inout->v_,
                       (vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                        *)&local_158);
            goto LAB_002c9a56;
          }
        }
LAB_002c9d14:
        if ((int)uVar4 < 0x10002b) {
          if (uVar4 == 0x2b) goto LAB_002c9ad8;
          goto LAB_002c9d29;
        }
        if (uVar4 != 0x10002b) goto LAB_002c9da1;
      }
      else if (uVar4 != 0x10002b) {
        return false;
      }
      if (roleTyId == 0x10003d) {
        Value::get_value<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>
                  ((optional<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
                    *)&local_a8,inout,false);
        local_138[0] = local_a8.has_value_;
        if (local_a8.has_value_ == true) {
          sStack_130._0_2_ = local_a8.contained._0_2_;
          sStack_130._2_2_ =
               (undefined2)(CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_) >> 0x10);
          sStack_130._4_4_ =
               (undefined4)
               (CONCAT17(local_a8.contained._7_1_,
                         CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) >> 0x20);
          sStack_130._16_8_ = CONCAT17(local_a8.contained._23_1_,local_a8.contained._16_7_);
          sStack_130._8_4_ =
               (undefined4)CONCAT43(local_a8.contained._11_4_,local_a8.contained._8_3_);
          sStack_130._12_4_ =
               (undefined4)
               (CONCAT17(local_a8.contained._15_1_,
                         CONCAT43(local_a8.contained._11_4_,local_a8.contained._8_3_)) >> 0x20);
          local_a8._7_4_ = local_a8._7_4_ & 0xff;
          local_a8.contained._3_4_ = 0;
          local_a8.contained._7_4_ = 0;
          local_a8.contained._11_4_ = 0;
          local_a8.contained._15_1_ = 0;
          local_a8.contained._16_7_ = 0;
          local_a8.contained._23_1_ = 0;
          ::std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::vector
                    ((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                     &local_a8,
                     (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                     (auStack_134 + 4));
          local_158.
          super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_158.
          super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_158.
          super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ::std::vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>::resize
                    ((vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)
                     &local_158,
                     CONCAT17(local_a8.contained._7_1_,
                              CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) -
                     CONCAT17(local_a8._7_1_,
                              CONCAT25(local_a8._5_2_,
                                       CONCAT23(local_a8._3_2_,
                                                CONCAT21(local_a8._1_2_,local_a8.has_value_)))) >> 4
                    );
          pvVar2 = (void *)CONCAT17(local_a8._7_1_,
                                    CONCAT25(local_a8._5_2_,
                                             CONCAT23(local_a8._3_2_,
                                                      CONCAT21(local_a8._1_2_,local_a8.has_value_)))
                                   );
          memcpy(local_158.
                 super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                 ._M_impl.super__Vector_impl_data._M_start,pvVar2,
                 CONCAT17(local_a8.contained._7_1_,
                          CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) -
                 (long)pvVar2);
          linb::any::operator=
                    (&inout->v_,
                     (vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)
                     &local_158);
          goto LAB_002c9a56;
        }
      }
LAB_002c9c02:
      if ((int)uVar4 < 0x10002f) goto LAB_002c9d29;
    }
LAB_002c9da1:
    if (uVar4 == 0x10002f) {
      if (roleTyId == 0x10003e) {
        Value::get_value<std::vector<std::array<double,4ul>,std::allocator<std::array<double,4ul>>>>
                  ((optional<std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>_>
                    *)&local_a8,inout,false);
        local_138[0] = local_a8.has_value_;
        if (local_a8.has_value_ == true) {
          sStack_130._0_2_ = local_a8.contained._0_2_;
          sStack_130._2_2_ =
               (undefined2)(CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_) >> 0x10);
          sStack_130._4_4_ =
               (undefined4)
               (CONCAT17(local_a8.contained._7_1_,
                         CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) >> 0x20);
          sStack_130._16_8_ = CONCAT17(local_a8.contained._23_1_,local_a8.contained._16_7_);
          sStack_130._8_4_ =
               (undefined4)CONCAT43(local_a8.contained._11_4_,local_a8.contained._8_3_);
          sStack_130._12_4_ =
               (undefined4)
               (CONCAT17(local_a8.contained._15_1_,
                         CONCAT43(local_a8.contained._11_4_,local_a8.contained._8_3_)) >> 0x20);
          local_a8._7_4_ = local_a8._7_4_ & 0xff;
          local_a8.contained._3_4_ = 0;
          local_a8.contained._7_4_ = 0;
          local_a8.contained._11_4_ = 0;
          local_a8.contained._15_1_ = 0;
          local_a8.contained._16_7_ = 0;
          local_a8.contained._23_1_ = 0;
          ::std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::vector
                    ((vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                     &local_a8,
                     (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                     (auStack_134 + 4));
          local_158.
          super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_158.
          super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_158.
          super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ::std::vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>::resize
                    ((vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)
                     &local_158,
                     CONCAT17(local_a8.contained._7_1_,
                              CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) -
                     CONCAT17(local_a8._7_1_,
                              CONCAT25(local_a8._5_2_,
                                       CONCAT23(local_a8._3_2_,
                                                CONCAT21(local_a8._1_2_,local_a8.has_value_)))) >> 5
                    );
          pvVar2 = (void *)CONCAT17(local_a8._7_1_,
                                    CONCAT25(local_a8._5_2_,
                                             CONCAT23(local_a8._3_2_,
                                                      CONCAT21(local_a8._1_2_,local_a8.has_value_)))
                                   );
          memcpy(local_158.
                 super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                 ._M_impl.super__Vector_impl_data._M_start,pvVar2,
                 CONCAT17(local_a8.contained._7_1_,
                          CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) -
                 (long)pvVar2);
          linb::any::operator=
                    (&inout->v_,
                     (vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)
                     &local_158);
          goto LAB_002c9a56;
        }
      }
      goto LAB_002c9e7c;
    }
    if (uVar4 != 0x100038) {
      return false;
    }
  }
  if (roleTyId != 0x100048) {
    return false;
  }
  Value::get_value<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>
            ((optional<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
              *)&local_a8,inout,false);
  local_138[0] = local_a8.has_value_;
  if (local_a8.has_value_ != true) {
    return false;
  }
  sStack_130._0_2_ = local_a8.contained._0_2_;
  sStack_130._2_2_ =
       (undefined2)(CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_) >> 0x10);
  sStack_130._4_4_ =
       (undefined4)
       (CONCAT17(local_a8.contained._7_1_,
                 CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) >> 0x20);
  sStack_130._16_8_ = CONCAT17(local_a8.contained._23_1_,local_a8.contained._16_7_);
  sStack_130._8_4_ = (undefined4)CONCAT43(local_a8.contained._11_4_,local_a8.contained._8_3_);
  sStack_130._12_4_ =
       (undefined4)
       (CONCAT17(local_a8.contained._15_1_,
                 CONCAT43(local_a8.contained._11_4_,local_a8.contained._8_3_)) >> 0x20);
  local_a8._7_4_ = local_a8._7_4_ & 0xff;
  local_a8.contained._3_4_ = 0;
  local_a8.contained._7_4_ = 0;
  local_a8.contained._11_4_ = 0;
  local_a8.contained._15_1_ = 0;
  local_a8.contained._16_7_ = 0;
  local_a8.contained._23_1_ = 0;
  ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::vector
            ((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
             &local_a8,
             (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
             (auStack_134 + 4));
  local_158.super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<tinyusdz::value::frame4d,_std::allocator<tinyusdz::value::frame4d>_>::resize
            ((vector<tinyusdz::value::frame4d,_std::allocator<tinyusdz::value::frame4d>_> *)
             &local_158,
             CONCAT17(local_a8.contained._7_1_,
                      CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) -
             CONCAT17(local_a8._7_1_,
                      CONCAT25(local_a8._5_2_,
                               CONCAT23(local_a8._3_2_,CONCAT21(local_a8._1_2_,local_a8.has_value_))
                              )) >> 7);
  pvVar2 = (void *)CONCAT17(local_a8._7_1_,
                            CONCAT25(local_a8._5_2_,
                                     CONCAT23(local_a8._3_2_,
                                              CONCAT21(local_a8._1_2_,local_a8.has_value_))));
  memcpy(local_158.
         super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
         _M_impl.super__Vector_impl_data._M_start,pvVar2,
         CONCAT17(local_a8.contained._7_1_,
                  CONCAT43(local_a8.contained._3_4_,local_a8.contained._0_3_)) - (long)pvVar2);
  linb::any::operator=
            (&inout->v_,
             (vector<tinyusdz::value::frame4d,_std::allocator<tinyusdz::value::frame4d>_> *)
             &local_158);
LAB_002c9a56:
  if (local_158.
      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.
                    super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.
                          super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.
                          super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pvVar2 = (void *)CONCAT17(local_a8._7_1_,
                            CONCAT25(local_a8._5_2_,
                                     CONCAT23(local_a8._3_2_,
                                              CONCAT21(local_a8._1_2_,local_a8.has_value_))));
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,CONCAT17(local_a8.contained._15_1_,
                                    CONCAT43(local_a8.contained._11_4_,local_a8.contained._8_3_)) -
                           (long)pvVar2);
  }
  if ((local_138[0] == true) &&
     (pvVar2 = (void *)CONCAT44(sStack_130._4_4_,CONCAT22(sStack_130._2_2_,sStack_130._0_2_)),
     pvVar2 != (void *)0x0)) {
    operator_delete(pvVar2,sStack_130._16_8_ - (long)pvVar2);
  }
  return true;
}

Assistant:

bool RoleTypeCast(const uint32_t roleTyId, value::Value &inout) {
  const uint32_t srcUnderlyingTyId = inout.underlying_type_id();

  DCOUT("input type = " << inout.type_name());

  // scalar and array
#define ROLE_TYPE_CAST(__roleTy, __srcBaseTy)                                  \
  {                                                                            \
    static_assert(value::TypeTraits<__roleTy>::size() ==                       \
                      value::TypeTraits<__srcBaseTy>::size(),                  \
                  "");                                                         \
    if (srcUnderlyingTyId == value::TypeTraits<__srcBaseTy>::type_id()) {      \
      if (roleTyId == value::TypeTraits<__roleTy>::type_id()) {                \
        if (auto pv = inout.get_value<__srcBaseTy>()) {                        \
          __srcBaseTy val = pv.value();                                        \
          __roleTy newval;                                                     \
          memcpy(reinterpret_cast<__srcBaseTy *>(&newval), &val, sizeof(__srcBaseTy));                          \
          inout = newval;                                                      \
          return true;                                                         \
        }                                                                      \
      }                                                                        \
    } else if (srcUnderlyingTyId ==                                            \
               (value::TypeTraits<__srcBaseTy>::type_id() |                    \
                value::TYPE_ID_1D_ARRAY_BIT)) {                                \
      if (roleTyId == value::TypeTraits<std::vector<__roleTy>>::type_id()) {   \
        if (auto pv = inout.get_value<std::vector<__srcBaseTy>>()) {           \
          std::vector<__srcBaseTy> val = pv.value();                           \
          std::vector<__roleTy> newval;                                        \
          newval.resize(val.size());                                           \
          memcpy(reinterpret_cast<__srcBaseTy *>(newval.data()), val.data(), sizeof(__srcBaseTy) * val.size()); \
          inout = newval;                                                      \
          return true;                                                         \
        }                                                                      \
      }                                                                        \
    }                                                                          \
  }

  ROLE_TYPE_CAST(value::texcoord2h, value::half2)
  ROLE_TYPE_CAST(value::texcoord2f, value::float2)
  ROLE_TYPE_CAST(value::texcoord2d, value::double2)

  ROLE_TYPE_CAST(value::texcoord3h, value::half3)
  ROLE_TYPE_CAST(value::texcoord3f, value::float3)
  ROLE_TYPE_CAST(value::texcoord3d, value::double3)

  ROLE_TYPE_CAST(value::normal3h, value::half3)
  ROLE_TYPE_CAST(value::normal3f, value::float3)
  ROLE_TYPE_CAST(value::normal3d, value::double3)

  ROLE_TYPE_CAST(value::vector3h, value::half3)
  ROLE_TYPE_CAST(value::vector3f, value::float3)
  ROLE_TYPE_CAST(value::vector3d, value::double3)

  ROLE_TYPE_CAST(value::point3h, value::half3)
  ROLE_TYPE_CAST(value::point3f, value::float3)
  ROLE_TYPE_CAST(value::point3d, value::double3)

  ROLE_TYPE_CAST(value::color3h, value::half3)
  ROLE_TYPE_CAST(value::color3f, value::float3)
  ROLE_TYPE_CAST(value::color3d, value::double3)

  ROLE_TYPE_CAST(value::color4h, value::half4)
  ROLE_TYPE_CAST(value::color4f, value::float4)
  ROLE_TYPE_CAST(value::color4d, value::double4)

  ROLE_TYPE_CAST(value::frame4d, value::matrix4d)

#undef ROLE_TYPE_CAST

  return false;
}